

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

ifstream * __thiscall ev3dev::anon_unknown_20::ifstream_open(anon_unknown_20 *this,string *path)

{
  item *__s2;
  _List_node_base *__n;
  void *pvVar1;
  char cVar2;
  int iVar3;
  _List_node_base *p_Var4;
  undefined8 uVar5;
  undefined8 *unaff_R12;
  void *unaff_R13;
  void *unaff_R15;
  _List_node_base *p_Var6;
  
  if ((anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ == '\0')
  {
    _GLOBAL__N_1::ifstream_open();
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)
                             (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::mx)
  ;
  p_Var4 = DAT_00184f98;
  if (iVar3 != 0) {
    uVar5 = std::__throw_system_error(iVar3);
    if ((void *)*unaff_R12 != unaff_R13) {
      operator_delete((void *)*unaff_R12);
    }
    operator_delete(unaff_R15);
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::mx);
    _Unwind_Resume(uVar5);
  }
  if (DAT_00184f98 != (_List_node_base *)&DAT_00184f98) {
    __s2 = *(item **)this;
    __n = *(_List_node_base **)(this + 8);
    p_Var6 = DAT_00184f98;
    do {
      if ((p_Var6[1]._M_prev == __n) &&
         ((__n == (_List_node_base *)0x0 ||
          (path = &__s2->first, iVar3 = bcmp(p_Var6[1]._M_next,__s2,(size_t)__n), iVar3 == 0)))) {
        if (p_Var6->_M_next != p_Var4 && p_Var4 != p_Var6) {
          std::__detail::_List_node_base::_M_transfer(p_Var4,p_Var6);
        }
        goto LAB_00160dd7;
      }
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)&DAT_00184f98);
  }
  if ((anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ <
      DAT_00184fa8 + 1U) {
    do {
      pvVar1 = DAT_00184fa0;
      DAT_00184fa8 = DAT_00184fa8 + -1;
      std::__detail::_List_node_base::_M_unhook();
      std::
      allocator_traits<std::allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ifstream>::item>>>
      ::destroy<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ifstream>::item>
                ((allocator_type *)((long)pvVar1 + 0x10),(item *)path);
      operator_delete(pvVar1);
    } while ((anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ <
             DAT_00184fa8 + 1U);
  }
  p_Var4 = (_List_node_base *)operator_new(0x238);
  p_Var4[1]._M_next = p_Var4 + 2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var4 + 1),*(long *)this,*(long *)(this + 8) + *(long *)this);
  std::ifstream::ifstream(p_Var4 + 3);
  std::__detail::_List_node_base::_M_hook(p_Var4);
  DAT_00184fa8 = DAT_00184fa8 + 1;
LAB_00160dd7:
  p_Var4 = DAT_00184f98 + 3;
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             (anonymous_namespace)::ifstream_cache(std::__cxx11::string_const&)::mx);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::ifstream::open((string *)p_Var4,(_Ios_Openmode)this);
  }
  else {
    std::ios::clear((int)p_Var4->_M_next[-2]._M_prev + (int)p_Var4);
    std::istream::seekg((long)p_Var4,_S_beg);
  }
  return (ifstream *)p_Var4;
}

Assistant:

std::ifstream &ifstream_open(const std::string &path) {
    std::ifstream &file = ifstream_cache(path);
    if (!file.is_open()) {
        file.open(path);
    } else {
        // Clear the flags bits in case something happened (like reaching EOF).
        file.clear();
        file.seekg(0, std::ios::beg);
    }
    return file;
}